

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

void __thiscall GdlRule::FixGlyphAttrsInRules(GdlRule *this,GrcManager *pcman,GrcFont *pfont)

{
  pointer ppGVar1;
  GrcSymbolTableEntry *this_00;
  bool bVar2;
  __type _Var3;
  uint uVar4;
  pointer ppGVar5;
  GdlGlyphClassDefn *pglfc;
  GrcFont *local_78;
  GrcManager *local_70;
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> vpglfcInClasses;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  vpglfcInClasses.super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vpglfcInClasses.super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vpglfcInClasses.super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppGVar5 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppGVar1 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_78 = pfont;
  local_70 = pcman;
  do {
    if (ppGVar5 == ppGVar1) {
      ppGVar1 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppGVar5 = (this->m_vprit).
                     super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
                     super__Vector_impl_data._M_start; ppGVar5 != ppGVar1; ppGVar5 = ppGVar5 + 1) {
        (*(*ppGVar5)->_vptr_GdlRuleItem[0xb])(*ppGVar5,pcman);
      }
      FixFeatureTestsInRules(this,local_78);
      ppGVar1 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      uVar4 = 0;
      for (ppGVar5 = (this->m_vprit).
                     super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>._M_impl.
                     super__Vector_impl_data._M_start; ppGVar5 != ppGVar1; ppGVar5 = ppGVar5 + 1) {
        (*(*ppGVar5)->_vptr_GdlRuleItem[10])(*ppGVar5,pcman,&vpglfcInClasses,this,(ulong)uVar4);
        uVar4 = uVar4 + 1;
      }
      std::_Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::~_Vector_base
                (&vpglfcInClasses.
                  super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>);
      return;
    }
    this_00 = (*ppGVar5)->m_psymInput;
    if (this_00 == (GrcSymbolTableEntry *)0x0) {
LAB_001224ee:
      pglfc = (GdlGlyphClassDefn *)0x0;
      std::vector<GdlGlyphClassDefn*,std::allocator<GdlGlyphClassDefn*>>::
      emplace_back<GdlGlyphClassDefn*>
                ((vector<GdlGlyphClassDefn*,std::allocator<GdlGlyphClassDefn*>> *)&vpglfcInClasses,
                 &pglfc);
    }
    else {
      bVar2 = GrcSymbolTableEntry::FitsSymbolType(this_00,ksymtClass);
      if (!bVar2) {
        bVar2 = GrcSymbolTableEntry::FitsSymbolType(this_00,ksymtSpecialLb);
        if (!bVar2) goto LAB_001224ee;
      }
      GdlGlyphClassDefn::Undefined_abi_cxx11_();
      _Var3 = std::operator==(&this_00->m_staFieldName,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      pcman = local_70;
      if (_Var3) goto LAB_001224ee;
      pglfc = GrcSymbolTableEntry::GlyphClassDefnData(this_00);
      std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::push_back
                (&vpglfcInClasses,&pglfc);
    }
    ppGVar5 = ppGVar5 + 1;
  } while( true );
}

Assistant:

void GdlRule::FixGlyphAttrsInRules(GrcManager * pcman, GrcFont * pfont)
{
	//	Make a list of all the input-classes in the rule, for checking for the definition
	//	of glyph attributes in constraints and attribute-setters.
	std::vector<GdlGlyphClassDefn *> vpglfcInClasses;
	for (auto const prit: m_vprit)
	{
		Symbol psymInput = prit->m_psymInput;
		if (psymInput &&
			(psymInput->FitsSymbolType(ksymtClass) ||
				psymInput->FitsSymbolType(ksymtSpecialLb)) &&
				!psymInput->LastFieldIs(GdlGlyphClassDefn::Undefined()))
		{
			GdlGlyphClassDefn * pglfc = psymInput->GlyphClassDefnData();
			Assert(pglfc);
			vpglfcInClasses.push_back(pglfc);
		}
		else
			//	invalid input class
			vpglfcInClasses.push_back(NULL);
	}
	Assert(m_vprit.size() == vpglfcInClasses.size());

	//	Flatten slot attributes that use points to use integers instead. Do this
	//	entire process before fixing glyph attrs, because there can be some interaction between
	//	slots in a rule (eg, attach.to/at). So we can be sure at that point what state
	//	things are in.
	for (auto const prit: m_vprit)
	{
		prit->FlattenPointSlotAttrs(pcman);
	}

	//	While we're at it, fix the feature tests. Do this before fixing the glyph attributes,
	//	because it is possible to have feature tests embedded in conditional statements.
	FixFeatureTestsInRules(pfont);

	//	Now do the fixes, error checks, etc.
	auto index = 0;
	for (auto const prit: m_vprit)
	{
		prit->FixGlyphAttrsInRules(pcman, vpglfcInClasses, this, index++);
	}
}